

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

vector<RPCArg,_std::allocator<RPCArg>_> * wallet::OutputsDoc(void)

{
  string name;
  string name_00;
  string name_01;
  string name_02;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  string description;
  string description_00;
  string description_01;
  string description_02;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_00;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [66];
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  long lVar3;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  _Alloc_hider in_stack_fffffffffffff798;
  _Alloc_hider _Var4;
  undefined1 in_stack_fffffffffffff7a0 [24];
  undefined1 in_stack_fffffffffffff7b8 [56];
  bool in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f1;
  _Alloc_hider in_stack_fffffffffffff7f8;
  size_type in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff809 [15];
  pointer in_stack_fffffffffffff818;
  undefined2 in_stack_fffffffffffff820;
  undefined6 in_stack_fffffffffffff822;
  undefined2 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff82a;
  undefined6 in_stack_fffffffffffff832;
  bool in_stack_fffffffffffff838;
  bool bVar5;
  undefined7 in_stack_fffffffffffff839;
  _Alloc_hider in_stack_fffffffffffff840;
  _Alloc_hider _Var6;
  pointer in_stack_fffffffffffff848;
  pointer pRVar7;
  undefined1 in_stack_fffffffffffff850;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffff851 [15];
  pointer in_stack_fffffffffffff860;
  pointer pbVar9;
  undefined2 in_stack_fffffffffffff868;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffff86a;
  undefined6 uVar11;
  undefined2 in_stack_fffffffffffff870;
  undefined2 uVar12;
  undefined8 in_stack_fffffffffffff872;
  undefined8 uVar13;
  undefined6 in_stack_fffffffffffff87a;
  undefined1 in_stack_fffffffffffff880 [24];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_760;
  undefined1 local_708;
  string local_700 [32];
  RPCArg local_6e0;
  string local_5d8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5b8;
  undefined1 local_560;
  string local_558 [32];
  RPCArgOptions local_538;
  RPCArgOptions local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_468;
  undefined1 local_410;
  string local_408 [32];
  RPCArg local_3e8;
  string local_2e0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_2c0;
  undefined1 local_268;
  string local_260 [32];
  RPCArg local_240 [2];
  long local_30;
  undefined1 auVar2 [32];
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"",(allocator<char> *)&stack0xfffffffffffff7ef);
  local_2c0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_268 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e0,"",(allocator<char> *)&stack0xfffffffffffff7ee);
  std::__cxx11::string::string<std::allocator<char>>
            (local_408,"address",(allocator<char> *)&stack0xfffffffffffff7cf);
  local_468._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_410 = 0;
  std::operator+(&local_4a8,
                 "A key-value pair. The key (string) is the bitcoin address,\nthe value (float or string) is the amount in "
                 ,&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_488,&local_4a8,"");
  local_4f0.oneline_description._M_dataplus._M_p = (pointer)&local_4f0.oneline_description.field_2;
  local_4f0.skip_type_check = false;
  local_4f0.oneline_description._M_string_length = 0;
  local_4f0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4f0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4f0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4f0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4f0._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff7a0._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_fffffffffffff7a0._8_16_;
  name._M_dataplus._M_p = in_stack_fffffffffffff798._M_p;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_1_ = in_stack_fffffffffffff7f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_56_ = in_stack_fffffffffffff7b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _57_7_ = in_stack_fffffffffffff7f1;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7f8._M_p;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff800;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_1_ = in_stack_fffffffffffff808;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._81_15_
       = in_stack_fffffffffffff809;
  description._M_string_length._0_2_ = in_stack_fffffffffffff820;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  description._M_string_length._2_6_ = in_stack_fffffffffffff822;
  description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff828;
  description.field_2._2_8_ = in_stack_fffffffffffff82a;
  description.field_2._10_6_ = in_stack_fffffffffffff832;
  opts._1_7_ = in_stack_fffffffffffff839;
  opts.skip_type_check = in_stack_fffffffffffff838;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff840._M_p;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff848;
  opts.oneline_description.field_2._M_local_buf[0] = in_stack_fffffffffffff850;
  opts.oneline_description.field_2._1_15_ = in_stack_fffffffffffff851;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffff860;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = in_stack_fffffffffffff868;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_fffffffffffff86a;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = in_stack_fffffffffffff870;
  opts._58_8_ = in_stack_fffffffffffff872;
  opts._66_6_ = in_stack_fffffffffffff87a;
  RPCArg::RPCArg(&local_3e8,name,(Type)local_408,fallback,description,opts);
  __l._M_len = 1;
  __l._M_array = &local_3e8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7d0,__l,
             (allocator_type *)&stack0xfffffffffffff7ce);
  local_538.oneline_description._M_dataplus._M_p = (pointer)&local_538.oneline_description.field_2;
  local_538.skip_type_check = false;
  local_538.oneline_description._M_string_length = 0;
  local_538.oneline_description.field_2._M_local_buf[0] = '\0';
  local_538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_538.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_538._58_8_ = 0;
  _Var4._M_p = &local_538.skip_type_check;
  name_00._M_string_length = in_stack_fffffffffffff7a0._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff7a0._8_16_;
  name_00._M_dataplus._M_p = _Var4._M_p;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_1_ = in_stack_fffffffffffff7f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_56_ = in_stack_fffffffffffff7b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _57_7_ = in_stack_fffffffffffff7f1;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7f8._M_p;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff800;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_1_ = in_stack_fffffffffffff808;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._81_15_
       = in_stack_fffffffffffff809;
  description_00._M_string_length._0_2_ = in_stack_fffffffffffff820;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  description_00._M_string_length._2_6_ = in_stack_fffffffffffff822;
  description_00.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff828;
  description_00.field_2._2_8_ = in_stack_fffffffffffff82a;
  description_00.field_2._10_6_ = in_stack_fffffffffffff832;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
  ._1_7_ = in_stack_fffffffffffff839;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
  ._0_1_ = in_stack_fffffffffffff838;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffff840._M_p;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff848;
  opts_01._1_15_ = in_stack_fffffffffffff851;
  opts_01.skip_type_check = (bool)in_stack_fffffffffffff850;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff860;
  opts_01.oneline_description.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff868;
  opts_01.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff86a;
  opts_01.oneline_description.field_2._8_2_ = in_stack_fffffffffffff870;
  opts_01._34_8_ = in_stack_fffffffffffff872;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_6_ = in_stack_fffffffffffff87a;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff880._0_8_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff880._8_8_;
  opts_01.hidden = (bool)in_stack_fffffffffffff880[0x10];
  opts_01.also_positional = (bool)in_stack_fffffffffffff880[0x11];
  opts_01._66_6_ = in_stack_fffffffffffff880._18_6_;
  RPCArg::RPCArg(local_240,name_00,(Type)local_260,fallback_00,description_00,inner,opts_01);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"",(allocator<char> *)&stack0xfffffffffffff7cd);
  local_5b8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_560 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,"",(allocator<char> *)&stack0xfffffffffffff7cc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,"data",(allocator<char> *)&stack0xfffffffffffff7af);
  local_760._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_708 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff880,
             "A key-value pair. The key must be \"data\", the value is hex-encoded data",
             (allocator<char> *)&stack0xfffffffffffff7ae);
  _Var6._M_p = &stack0xfffffffffffff850;
  bVar5 = false;
  pRVar7 = (pointer)0x0;
  uVar8 = '\0';
  pbVar9 = (pointer)0x0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  name_01._M_string_length = in_stack_fffffffffffff7a0._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff7a0._8_16_;
  name_01._M_dataplus._M_p = _Var4._M_p;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_1_ = in_stack_fffffffffffff7f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_56_ = in_stack_fffffffffffff7b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _57_7_ = in_stack_fffffffffffff7f1;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7f8._M_p;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff800;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_1_ = in_stack_fffffffffffff808;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._81_15_
       = in_stack_fffffffffffff809;
  description_01._M_string_length._0_2_ = in_stack_fffffffffffff820;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  description_01._M_string_length._2_6_ = in_stack_fffffffffffff822;
  description_01.field_2._M_allocated_capacity._0_2_ = in_stack_fffffffffffff828;
  description_01.field_2._2_8_ = in_stack_fffffffffffff82a;
  description_01.field_2._10_6_ = in_stack_fffffffffffff832;
  auVar1 = ZEXT4066(CONCAT1525(in_stack_fffffffffffff851,
                               ZEXT1525(CONCAT87(_Var6._M_p,in_stack_fffffffffffff839)) << 8));
  opts_00._66_6_ = in_stack_fffffffffffff87a;
  auVar2 = auVar1._8_32_;
  opts_00.skip_type_check = (bool)auVar1[0];
  opts_00._1_7_ = auVar1._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar2._0_8_;
  opts_00.oneline_description._M_string_length = auVar2._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )auVar1._40_24_;
  opts_00.hidden = (bool)auVar1[0x40];
  opts_00.also_positional = (bool)auVar1[0x41];
  RPCArg::RPCArg(&local_6e0,name_01,(Type)local_700,fallback_01,description_01,opts_00);
  __l_00._M_len = 1;
  __l_00._M_array = &local_6e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7b0,__l_00,
             (allocator_type *)&stack0xfffffffffffff7ad);
  name_02._M_string_length = in_stack_fffffffffffff7a0._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff7a0._8_16_;
  name_02._M_dataplus._M_p = &stack0xfffffffffffff7f0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._81_15_
       = in_stack_fffffffffffff809;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_81_ = ZEXT7281(CONCAT864(&stack0xfffffffffffff808,
                              CONCAT757(in_stack_fffffffffffff7f1,
                                        CONCAT156(0,in_stack_fffffffffffff7b8))));
  description_02.field_2._10_6_ = in_stack_fffffffffffff832;
  description_02._0_26_ = ZEXT826(0) << 0x40;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start._1_7_ = in_stack_fffffffffffff839;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = bVar5;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)_Var6._M_p;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  opts_02._1_15_ = in_stack_fffffffffffff851;
  opts_02.skip_type_check = (bool)uVar8;
  opts_02.oneline_description._M_string_length = (size_type)pbVar9;
  opts_02.oneline_description.field_2._M_allocated_capacity._0_2_ = uVar10;
  opts_02.oneline_description.field_2._M_allocated_capacity._2_6_ = uVar11;
  opts_02.oneline_description.field_2._8_2_ = uVar12;
  opts_02._34_8_ = uVar13;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_6_ = in_stack_fffffffffffff87a;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff880._0_8_;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff880._8_8_;
  opts_02.hidden = (bool)in_stack_fffffffffffff880[0x10];
  opts_02.also_positional = (bool)in_stack_fffffffffffff880[0x11];
  opts_02._66_6_ = in_stack_fffffffffffff880._18_6_;
  RPCArg::RPCArg(local_240 + 1,name_02,(Type)local_558,fallback_02,description_02,inner_00,opts_02);
  __l_01._M_len = 2;
  __l_01._M_array = local_240;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (in_RDI,__l_01,(allocator_type *)&stack0xfffffffffffff7ac);
  lVar3 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_240[0].m_names._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x108;
  } while (lVar3 != -0x108);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&stack0xfffffffffffff7f0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7b0);
  RPCArg::~RPCArg(&local_6e0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&stack0xfffffffffffff838);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff880);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_760._M_first);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_5d8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5b8._M_first);
  std::__cxx11::string::~string(local_558);
  RPCArgOptions::~RPCArgOptions(&local_538);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff7d0);
  RPCArg::~RPCArg(&local_3e8);
  RPCArgOptions::~RPCArgOptions(&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_468._M_first);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_2e0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_2c0._M_first);
  std::__cxx11::string::~string(local_260);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> OutputsDoc()
{
    return
    {
        {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
            {
                {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address,\n"
                         "the value (float or string) is the amount in " + CURRENCY_UNIT + ""},
            },
        },
        {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
            {
                {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "A key-value pair. The key must be \"data\", the value is hex-encoded data"},
            },
        },
    };
}